

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O1

void __thiscall
CVmObjByteArray::fill_with
          (CVmObjByteArray *this,uchar val,unsigned_long start_idx,unsigned_long cnt)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)*(uint *)(this->super_CVmObject).ext_;
  if (uVar3 < start_idx) {
    cnt = 0;
  }
  else if (uVar3 < (start_idx + cnt) - 1) {
    cnt = (uVar3 - start_idx) + 1;
  }
  if (cnt != 0) {
    do {
      uVar1 = (uint)(start_idx - 1);
      uVar2 = (ulong)(uVar1 & 0x7fff);
      uVar3 = 0x8000 - uVar2;
      if (cnt <= uVar3) {
        uVar3 = cnt;
      }
      memset((void *)(uVar2 + *(long *)(*(long *)((this->super_CVmObject).ext_ +
                                                 (start_idx - 1 >> 0x1c) * 8 + 4) +
                                       (ulong)(uVar1 >> 0xc & 0xfff8))),(uint)val,uVar3);
      start_idx = start_idx + uVar3;
      cnt = cnt - uVar3;
    } while (cnt != 0);
  }
  return;
}

Assistant:

void CVmObjByteArray::fill_with(unsigned char val, unsigned long start_idx,
                                unsigned long cnt)
{
    unsigned long idx;
    unsigned long rem;
    
    /* ensure we don't overrun the array */
    if (start_idx > get_element_count())
        cnt = 0;
    else if (start_idx + cnt - 1 > get_element_count())
        cnt = get_element_count() + 1 - start_idx;

    /* continue until we exhaust the count */
    for (idx = start_idx, rem = cnt ; rem != 0 ; )
    {
        size_t avail;
        size_t chunk_size;
        unsigned char *p;
        
        /* get the next chunk */
        p = get_ele_ptr(idx, &avail);

        /* limit this chunk size to the remaining size to fill */
        chunk_size = avail;
        if (chunk_size > rem)
            chunk_size = (size_t)rem;

        /* fill this chunk */
        memset(p, val, chunk_size);

        /* skip this chunk */
        rem -= chunk_size;
        idx += chunk_size;
    }
}